

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ItemFocusable(ImGuiWindow *window,ImGuiID id)

{
  byte *pbVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  int iVar5;
  
  pIVar3 = GImGui;
  if ((id == 0) || ((window->DC).LastItemId != id)) {
    __assert_fail("id != 0 && id == window->DC.LastItemId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xcc1,"void ImGui::ItemFocusable(ImGuiWindow *, ImGuiID)");
  }
  uVar2 = GImGui->CurrentItemFlags;
  iVar4 = (window->DC).FocusCounterRegular + 1;
  (window->DC).FocusCounterRegular = iVar4;
  if ((uVar2 & 5) == 0) {
    iVar5 = (window->DC).FocusCounterTabStop + 1;
    (window->DC).FocusCounterTabStop = iVar5;
    if (pIVar3->NavId == id) {
      pIVar3->NavIdTabCounter = iVar5;
    }
  }
  if ((((pIVar3->ActiveId == id) && (pIVar3->TabFocusPressed == true)) &&
      ((pIVar3->ActiveIdUsingKeyInputMask & 1) == 0)) &&
     (pIVar3->TabFocusRequestNextWindow == (ImGuiWindow *)0x0)) {
    pIVar3->TabFocusRequestNextWindow = window;
    iVar5 = 1;
    if ((pIVar3->IO).KeyShift != false) {
      iVar5 = -(uint)((uVar2 & 5) == 0);
    }
    pIVar3->TabFocusRequestNextCounterTabStop = iVar5 + (window->DC).FocusCounterTabStop;
  }
  if (pIVar3->TabFocusRequestCurrWindow == window) {
    if (iVar4 == pIVar3->TabFocusRequestCurrCounterRegular) {
      pbVar1 = (byte *)((long)&(window->DC).LastItemStatusFlags + 1);
      *pbVar1 = *pbVar1 | 1;
      return;
    }
    if (((uVar2 & 5) == 0) &&
       ((window->DC).FocusCounterTabStop == pIVar3->TabFocusRequestCurrCounterTabStop)) {
      pIVar3->NavJustTabbedId = id;
      pbVar1 = (byte *)((long)&(window->DC).LastItemStatusFlags + 1);
      *pbVar1 = *pbVar1 | 2;
      return;
    }
    if (pIVar3->ActiveId == id) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemFocusable(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0 && id == window->DC.LastItemId);

    // Increment counters
    // FIXME: ImGuiItemFlags_Disabled should disable more.
    const bool is_tab_stop = (g.CurrentItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->DC.FocusCounterRegular++;
    if (is_tab_stop)
    {
        window->DC.FocusCounterTabStop++;
        if (g.NavId == id)
            g.NavIdTabCounter = window->DC.FocusCounterTabStop;
    }

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.TabFocusPressed && !IsActiveIdUsingKey(ImGuiKey_Tab) && g.TabFocusRequestNextWindow == NULL)
    {
        g.TabFocusRequestNextWindow = window;
        g.TabFocusRequestNextCounterTabStop = window->DC.FocusCounterTabStop + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.TabFocusRequestCurrWindow == window)
    {
        if (window->DC.FocusCounterRegular == g.TabFocusRequestCurrCounterRegular)
        {
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_FocusedByCode;
            return;
        }
        if (is_tab_stop && window->DC.FocusCounterTabStop == g.TabFocusRequestCurrCounterTabStop)
        {
            g.NavJustTabbedId = id;
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_FocusedByTabbing;
            return;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }
}